

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O1

DOMDocument * __thiscall
xercesc_4_0::DOMLSParserImpl::parse(DOMLSParserImpl *this,DOMLSInput *source)

{
  DOMDocument *pDVar1;
  DOMException *this_00;
  Wrapper4DOMLSInput isWrapper;
  Wrapper4DOMLSInput WStack_58;
  
  if ((this->super_AbstractDOMParser).fParseInProgress != true) {
    if (this->fFilter == (DOMLSParserFilter *)&g_AbortFilter) {
      this->fFilter = (DOMLSParserFilter *)0x0;
    }
    if (this->fFilterAction !=
        (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *)
        0x0) {
      ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::
      removeAll(this->fFilterAction);
    }
    if (this->fFilterDelayedTextNodes != (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0) {
      ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::removeAll(this->fFilterDelayedTextNodes);
    }
    Wrapper4DOMLSInput::Wrapper4DOMLSInput
              (&WStack_58,source,this->fEntityResolver,false,
               (this->super_AbstractDOMParser).fMemoryManager);
    AbstractDOMParser::parse(&this->super_AbstractDOMParser,&WStack_58.super_InputSource);
    if (this->fUserAdoptsDocument == true) {
      pDVar1 = AbstractDOMParser::adoptDocument(&this->super_AbstractDOMParser);
    }
    else {
      pDVar1 = AbstractDOMParser::getDocument(&this->super_AbstractDOMParser);
    }
    Wrapper4DOMLSInput::~Wrapper4DOMLSInput(&WStack_58);
    return pDVar1;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_00,0xb,0x21,(this->super_AbstractDOMParser).fMemoryManager);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMDocument* DOMLSParserImpl::parse(const DOMLSInput* source)
{
    if (getParseInProgress())
        throw DOMException(DOMException::INVALID_STATE_ERR, XMLDOMMsg::LSParser_ParseInProgress, fMemoryManager);

    // remove the abort filter, if present
    if(fFilter==&g_AbortFilter)
        fFilter=0;
    if(fFilterAction)
        fFilterAction->removeAll();
    if(fFilterDelayedTextNodes)
        fFilterDelayedTextNodes->removeAll();

    Wrapper4DOMLSInput isWrapper((DOMLSInput*)source, fEntityResolver, false, getMemoryManager());

    AbstractDOMParser::parse(isWrapper);

    // Disabled until 4.0.0. See XERCESC-1894 for details.
    //if(getErrorCount()!=0)
    //    throw DOMLSException(DOMLSException::PARSE_ERR, XMLDOMMsg::LSParser_ParsingFailed, fMemoryManager);

    if (fUserAdoptsDocument)
        return adoptDocument();
    else
        return getDocument();
}